

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

void __thiscall slack::_detail::Session::SetBody(Session *this,string *data)

{
  CURL *pCVar1;
  undefined8 uVar2;
  string *data_local;
  Session *this_local;
  
  if (this->curl_ != (CURL *)0x0) {
    pCVar1 = this->curl_;
    uVar2 = std::__cxx11::string::length();
    curl_easy_setopt(pCVar1,0x3c,uVar2);
    pCVar1 = this->curl_;
    uVar2 = std::__cxx11::string::data();
    curl_easy_setopt(pCVar1,0x271f,uVar2);
  }
  return;
}

Assistant:

inline
void Session::SetBody(const std::string& data) { 
        if (curl_) {
            curl_easy_setopt(curl_, CURLOPT_POSTFIELDSIZE, data.length());
            curl_easy_setopt(curl_, CURLOPT_POSTFIELDS, data.data());
        }
    }